

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::MakeUtf8SourceInfo
          (ScriptContext *this,byte *script,size_t cb,SRCINFO *pSrcInfo,
          Utf8SourceInfo **ppSourceInfo,LoadScriptFlag loadScriptFlag,Var scriptSource)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  Utf8SourceInfo *pUVar6;
  TrackAllocData local_88;
  size_t local_60;
  size_t cbUtf8Buffer;
  charcount_t ccLength;
  bool isLibraryCode;
  size_t cbNeeded;
  size_t length;
  LPUTF8 utf8Script;
  Utf8SourceInfo **ppUStack_30;
  LoadScriptFlag loadScriptFlag_local;
  Utf8SourceInfo **ppSourceInfo_local;
  SRCINFO *pSrcInfo_local;
  size_t cb_local;
  byte *script_local;
  ScriptContext *this_local;
  
  length = 0;
  _ccLength = 0;
  cbUtf8Buffer._7_1_ = (loadScriptFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_LibraryCode;
  utf8Script._4_4_ = loadScriptFlag;
  ppUStack_30 = ppSourceInfo;
  ppSourceInfo_local = (Utf8SourceInfo **)pSrcInfo;
  pSrcInfo_local = (SRCINFO *)cb;
  cb_local = (size_t)script;
  script_local = (byte *)this;
  if ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source) {
    cbNeeded = cb;
    if ((loadScriptFlag & LoadScriptFlag_ExternalArrayBuffer) == LoadScriptFlag_None) {
      pUVar6 = Utf8SourceInfo::New(this,script,(int32)cb,cb,pSrcInfo,(bool)cbUtf8Buffer._7_1_);
      *ppUStack_30 = pUVar6;
    }
    else {
      pUVar6 = Utf8SourceInfo::NewWithNoCopy
                         (this,script,(int32)cb,cb,pSrcInfo,(bool)cbUtf8Buffer._7_1_,scriptSource);
      *ppUStack_30 = pUVar6;
    }
  }
  else {
    cbNeeded = cb >> 1;
    bVar2 = IsValidCharCount(cbNeeded);
    if (!bVar2) {
      Throw::OutOfMemory();
    }
    if (0x7ffffffe < cbNeeded) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x7a3,"(length < 0x7fffffff)","length < MAXLONG");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    cbUtf8Buffer._0_4_ = (uint32)cbNeeded;
    uVar3 = UInt32Math::MulAdd<3u,1u>((uint32)cbNeeded);
    local_60 = (size_t)uVar3;
    pRVar5 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,(type_info *)&unsigned_char::typeinfo,0,local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x7ad);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_88);
    length = (size_t)Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                               ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeafTrace,0,
                                local_60);
    _ccLength = utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                          ((utf8char_t *)length,local_60,(char16 *)cb_local,
                           (charcount_t)cbUtf8Buffer);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec4520,ParsePhase);
    if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
      Output::Print(L"Loading script.\n  Unicode (in bytes)    %u\n  UTF-8 size (in bytes) %u\n  Expected savings      %d\n"
                    ,cbNeeded << 1,_ccLength,cbNeeded * 2 - _ccLength);
    }
    if (local_60 < _ccLength + 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x7bc,"(cbNeeded + 1 <= cbUtf8Buffer)",
                                  "cbNeeded + 1 <= cbUtf8Buffer");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pUVar6 = Utf8SourceInfo::New(this,(LPCUTF8)length,(int32)cbNeeded,_ccLength,
                                 (SRCINFO *)ppSourceInfo_local,(bool)(cbUtf8Buffer._7_1_ & 1));
    *ppUStack_30 = pUVar6;
  }
  return;
}

Assistant:

void ScriptContext::MakeUtf8SourceInfo(const byte* script,
        size_t cb,
        SRCINFO const * pSrcInfo,
        Utf8SourceInfo** ppSourceInfo,
        LoadScriptFlag loadScriptFlag,
        Js::Var scriptSource)
    {
        LPUTF8 utf8Script = nullptr;
        size_t length = cb;
        size_t cbNeeded = 0;

        bool isLibraryCode = ((loadScriptFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_LibraryCode);

        if ((loadScriptFlag & LoadScriptFlag_Utf8Source) != LoadScriptFlag_Utf8Source)
        {
            // Convert to UTF8 and then load that
            length = cb / sizeof(char16);
            if (!IsValidCharCount(length))
            {
                Js::Throw::OutOfMemory();
            }
            Assert(length < MAXLONG);
            charcount_t ccLength = static_cast<charcount_t>(length);

            // Allocate memory for the UTF8 output buffer.
            // We need at most 3 bytes for each Unicode code point.
            // The + 1 is to include the terminating NUL.
            // Nit:  Technically, we know that the NUL only needs 1 byte instead of
            // 3, but that's difficult to express in a SAL annotation for "EncodeInto".
            size_t cbUtf8Buffer = UInt32Math::MulAdd<3, 1>(ccLength);

            utf8Script = RecyclerNewArrayLeafTrace(this->GetRecycler(), utf8char_t, cbUtf8Buffer);

            cbNeeded = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8Script, cbUtf8Buffer, (const char16*)script, ccLength);

#if DBG_DUMP && defined(PROFILE_MEM)
            if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::ParsePhase) && Configuration::Global.flags.Verbose)
            {
                Output::Print(_u("Loading script.\n")
                    _u("  Unicode (in bytes)    %u\n")
                    _u("  UTF-8 size (in bytes) %u\n")
                    _u("  Expected savings      %d\n"), length * sizeof(char16), cbNeeded, length * sizeof(char16) - cbNeeded);
            }
#endif

            // Free unused bytes
            Assert(cbNeeded + 1 <= cbUtf8Buffer);
            *ppSourceInfo = Utf8SourceInfo::New(this, utf8Script, (int)length,
                cbNeeded, pSrcInfo, isLibraryCode);
        }
        else
        {
            // We do not own the memory passed into DefaultLoadScriptUtf8. We need to save it so we copy the memory.
#ifndef NTBUILD
            if (loadScriptFlag & LoadScriptFlag_ExternalArrayBuffer)
            {
                *ppSourceInfo = Utf8SourceInfo::NewWithNoCopy(this,
                    script, (int)length, cb, pSrcInfo, isLibraryCode,
                    scriptSource);
            }
            else
#endif
            {
                // The 'length' here is not correct (we will get the length from the parser) however parser isn't done yet.
                // Once the parser is done we will update the utf8sourceinfo's length correctly
                *ppSourceInfo = Utf8SourceInfo::New(this, script,
                    (int)length, cb, pSrcInfo, isLibraryCode);
            }
        }
    }